

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBasePrivate::QFutureInterfaceBasePrivate
          (QFutureInterfaceBasePrivate *this,State initialState)

{
  long in_RDI;
  ResultStoreBase *this_00;
  long lVar1;
  QWaitCondition *in_stack_ffffffffffffffb0;
  
  QMutex::QMutex((QMutex *)0x6df2a8);
  QBasicMutex::QBasicMutex((QBasicMutex *)0x6df2b6);
  QList<QFutureCallOutInterface_*>::QList((QList<QFutureCallOutInterface_*> *)0x6df2cb);
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)(in_RDI + 0x28));
  QWaitCondition::QWaitCondition(in_stack_ffffffffffffffb0);
  QWaitCondition::QWaitCondition(in_stack_ffffffffffffffb0);
  this_00 = (ResultStoreBase *)(in_RDI + 0x48);
  QtPrivate::ResultStoreBase::ResultStoreBase(this_00);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  lVar1 = in_RDI + 0x88;
  std::function<void_(const_QFutureInterfaceBase_&)>::function
            ((function<void_(const_QFutureInterfaceBase_&)> *)this_00);
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  RefCount::RefCount((RefCount *)this_00,(int)((ulong)lVar1 >> 0x20),(int)lVar1);
  QAtomicInt::QAtomicInt((QAtomicInt *)this_00,(int)((ulong)lVar1 >> 0x20));
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
  ::QScopedPointer((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                    *)(in_RDI + 200),(ProgressData *)0x0);
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  *(undefined1 *)(in_RDI + 0xd4) = 0;
  *(undefined1 *)(in_RDI + 0xd5) = 0;
  *(undefined1 *)(in_RDI + 0xd6) = 0;
  std::atomic<QFutureInterfaceBasePrivate::ContinuationState>::atomic
            ((atomic<QFutureInterfaceBasePrivate::ContinuationState> *)(in_RDI + 0xd7),Default);
  *(undefined1 *)(in_RDI + 0xd8) = 0;
  *(undefined1 *)(in_RDI + 0xd9) = 0;
  QElapsedTimer::invalidate((QElapsedTimer *)(in_RDI + 0x28));
  return;
}

Assistant:

QFutureInterfaceBasePrivate::QFutureInterfaceBasePrivate(QFutureInterfaceBase::State initialState)
    : state(initialState)
{
    progressTime.invalidate();
}